

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

bool __thiscall Js::ScriptContext::IsIntlEnabled(ScriptContext *this)

{
  return ((this->config).threadConfig)->m_Intl;
}

Assistant:

bool ScriptContext::IsIntlEnabled()
    {
#ifdef ENABLE_INTL_OBJECT
        if (GetConfig()->IsIntlEnabled())
        {
#ifdef INTL_WINGLOB
            // This will try to load globalization dlls if not already loaded.
            Js::DelayLoadWindowsGlobalization* globLibrary = GetThreadContext()->GetWindowsGlobalizationLibrary();
            return globLibrary->HasGlobalizationDllLoaded();
#else
            return true;
#endif
        }
#endif
        return false;
    }